

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void state_BREAKP(Context *ctx)

{
  int iVar1;
  char *reason;
  
  if (ctx->source_args[0].regtype == REG_TYPE_MAX) {
    iVar1 = replicate_swizzle(ctx->source_args[0].swizzle);
    if (iVar1 == 0) {
      reason = "BREAKP without replicate swizzzle";
    }
    else {
      if ((ctx->loops != 0) || (ctx->reps != 0)) {
        return;
      }
      reason = "BREAKP outside LOOP/ENDLOOP or REP/ENDREP";
    }
  }
  else {
    reason = "BREAKP argument isn\'t predicate register";
  }
  fail(ctx,reason);
  return;
}

Assistant:

static void state_BREAKP(Context *ctx)
{
    const RegisterType regtype = ctx->source_args[0].regtype;
    if (regtype != REG_TYPE_PREDICATE)
        fail(ctx, "BREAKP argument isn't predicate register");
    else if (!replicate_swizzle(ctx->source_args[0].swizzle))
        fail(ctx, "BREAKP without replicate swizzzle");
    else if ((ctx->loops == 0) && (ctx->reps == 0))
        fail(ctx, "BREAKP outside LOOP/ENDLOOP or REP/ENDREP");
}